

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

void jsonnet::internal::fodder_fill
               (ostream *o,Fodder *fodder,bool space_before,bool separate_token,bool final)

{
  Kind KVar1;
  bool bVar2;
  size_type sVar3;
  ostream *poVar4;
  const_reference pvVar5;
  long lVar6;
  byte in_CL;
  byte in_DL;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_RSI;
  ostream *in_RDI;
  byte in_R8B;
  string *l;
  const_iterator __end4;
  const_iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  bool first;
  bool skip_trailing;
  FodderElement *fod;
  const_iterator __end2;
  const_iterator __begin2;
  Fodder *__range2;
  size_t index;
  uint last_indent;
  ostream *in_stack_fffffffffffffe28;
  __normal_iterator<const_jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
  *in_stack_fffffffffffffe30;
  allocator<char> *in_stack_fffffffffffffe38;
  ostream *in_stack_fffffffffffffe40;
  ulong in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  bool local_13a;
  allocator<char> local_139;
  string local_138 [39];
  undefined1 local_111 [40];
  allocator<char> local_e9;
  string local_e8 [32];
  reference local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_b0;
  byte local_a2;
  allocator<char> local_a1;
  string local_a0 [55];
  allocator<char> local_69;
  string local_68 [39];
  bool local_41;
  reference local_40;
  FodderElement *local_38;
  __normal_iterator<const_jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
  local_30 [2];
  long local_20;
  uint local_18;
  byte local_13;
  byte local_12;
  byte local_11;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *local_10;
  ostream *local_8;
  
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  local_13 = in_R8B & 1;
  local_18 = 0;
  local_20 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_30[0]._M_current =
       (FodderElement *)
       std::
       vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
       begin((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)in_stack_fffffffffffffe28);
  local_38 = (FodderElement *)
             std::
             vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ::end((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                    *)in_stack_fffffffffffffe28);
  while (bVar2 = __gnu_cxx::operator!=
                           (in_stack_fffffffffffffe30,
                            (__normal_iterator<const_jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
                             *)in_stack_fffffffffffffe28), bVar2) {
    local_40 = __gnu_cxx::
               __normal_iterator<const_jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
               ::operator*(local_30);
    lVar6 = local_20;
    local_13a = false;
    if ((local_13 & 1) != 0) {
      sVar3 = std::
              vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              ::size(local_10);
      local_13a = lVar6 == sVar3 - 1;
    }
    local_41 = local_13a;
    KVar1 = local_40->kind;
    if (KVar1 == LINE_END) {
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_40->comment);
      if (sVar3 != 0) {
        poVar4 = std::operator<<(local_8,"  ");
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&local_40->comment,0);
        std::operator<<(poVar4,(string *)pvVar5);
      }
      std::operator<<(local_8,'\n');
      poVar4 = local_8;
      if ((local_41 & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                   (char)((ulong)in_stack_fffffffffffffe40 >> 0x38),in_stack_fffffffffffffe38);
        std::operator<<(poVar4,local_68);
        std::__cxx11::string::~string(local_68);
        std::allocator<char>::~allocator(&local_69);
        poVar4 = local_8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                   (char)((ulong)in_stack_fffffffffffffe40 >> 0x38),in_stack_fffffffffffffe38);
        std::operator<<(poVar4,local_a0);
        std::__cxx11::string::~string(local_a0);
        std::allocator<char>::~allocator(&local_a1);
      }
      local_18 = local_40->indent;
      local_11 = 0;
    }
    else if (KVar1 == INTERSTITIAL) {
      if ((local_11 & 1) != 0) {
        std::operator<<(local_8,' ');
      }
      poVar4 = local_8;
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_40->comment,0);
      std::operator<<(poVar4,(string *)pvVar5);
      local_11 = 1;
    }
    else if (KVar1 == PARAGRAPH) {
      local_a2 = 1;
      local_b0 = &local_40->comment;
      local_b8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffe28);
      local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffe28);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffe30,
                                (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffe28), bVar2) {
        local_c8 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_b8);
        lVar6 = std::__cxx11::string::length();
        poVar4 = local_8;
        if (lVar6 != 0) {
          if ((local_a2 & 1) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                       (char)((ulong)in_stack_fffffffffffffe40 >> 0x38),in_stack_fffffffffffffe38);
            std::operator<<(poVar4,local_e8);
            std::__cxx11::string::~string(local_e8);
            std::allocator<char>::~allocator(&local_e9);
          }
          std::operator<<(local_8,(string *)local_c8);
        }
        std::operator<<(local_8,'\n');
        local_a2 = 0;
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_b8);
      }
      if ((local_41 & 1U) == 0) {
        in_stack_fffffffffffffe48 = (ulong)local_40->blanks;
        in_stack_fffffffffffffe50 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_111;
        in_stack_fffffffffffffe40 = local_8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                   (char)((ulong)in_stack_fffffffffffffe40 >> 0x38),in_stack_fffffffffffffe38);
        std::operator<<(in_stack_fffffffffffffe40,(string *)(local_111 + 1));
        std::__cxx11::string::~string((string *)(local_111 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_111);
        in_stack_fffffffffffffe30 =
             (__normal_iterator<const_jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
              *)(ulong)local_40->indent;
        in_stack_fffffffffffffe38 = &local_139;
        in_stack_fffffffffffffe28 = local_8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                   (char)((ulong)in_stack_fffffffffffffe40 >> 0x38),in_stack_fffffffffffffe38);
        std::operator<<(in_stack_fffffffffffffe28,local_138);
        std::__cxx11::string::~string(local_138);
        std::allocator<char>::~allocator(&local_139);
      }
      local_18 = local_40->indent;
      local_11 = 0;
    }
    local_20 = local_20 + 1;
    __gnu_cxx::
    __normal_iterator<const_jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
    ::operator++(local_30);
  }
  if (((local_12 & 1) != 0) && ((local_11 & 1) != 0)) {
    std::operator<<(local_8,' ');
  }
  return;
}

Assistant:

void fodder_fill(std::ostream &o, const Fodder &fodder, bool space_before, bool separate_token, bool final)
{
    unsigned last_indent = 0;
    size_t index = 0;
    for (const auto &fod : fodder) {
        bool skip_trailing = final && (index == (fodder.size() - 1));
        switch (fod.kind) {
            case FodderElement::LINE_END:
                if (fod.comment.size() > 0)
                    o << "  " << fod.comment[0];
                o << '\n';
                if (!skip_trailing) {
                    o << std::string(fod.blanks, '\n');
                    o << std::string(fod.indent, ' ');
                }
                last_indent = fod.indent;
                space_before = false;
                break;

            case FodderElement::INTERSTITIAL:
                if (space_before)
                    o << ' ';
                o << fod.comment[0];
                space_before = true;
                break;

            case FodderElement::PARAGRAPH: {
                bool first = true;
                for (const std::string &l : fod.comment) {
                    // Do not indent empty lines (note: first line is never empty).
                    if (l.length() > 0) {
                        // First line is already indented by previous fod.
                        if (!first)
                            o << std::string(last_indent, ' ');
                        o << l;
                    }
                    o << '\n';
                    first = false;
                }
                if (!skip_trailing) {
                    o << std::string(fod.blanks, '\n');
                    o << std::string(fod.indent, ' ');
                }
                last_indent = fod.indent;
                space_before = false;
            } break;
        }
        ++index;
    }
    if (separate_token && space_before)
        o << ' ';
}